

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O0

void __thiscall obs::safe_list<obs::slot<void_()>_>::node::node(node *this,slot<void_()> *value)

{
  id iVar1;
  slot<void_()> *value_local;
  node *this_local;
  
  this->value = value;
  this->locks = 0;
  this->next = (node *)0x0;
  iVar1 = std::this_thread::get_id();
  (this->creator_thread)._M_thread = iVar1._M_thread;
  this->creator_thread_iterator = (iterator *)0x0;
  return;
}

Assistant:

node(T* value = nullptr)
      : value(value),
        creator_thread(std::this_thread::get_id()) {
    }